

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<kj::Promise<int>_>::dispose(ArrayBuilder<kj::Promise<int>_> *this)

{
  Promise<int> *pPVar1;
  RemoveConst<kj::Promise<int>_> *pRVar2;
  Promise<int> *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Promise<int> *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->endPtr = (Promise<int> *)0x0;
    this->ptr = (Promise<int> *)0x0;
    this->pos = (RemoveConst<kj::Promise<int>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,0x10,(long)pRVar2 - (long)pPVar1 >> 4,
               (long)pPVar3 - (long)pPVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Promise<int>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }